

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O0

void __thiscall
InProcNativeEntryPointData::InProcNativeEntryPointData(InProcNativeEntryPointData *this)

{
  code *pcVar1;
  bool bVar2;
  JITManager *this_00;
  undefined4 *puVar3;
  InProcNativeEntryPointData *this_local;
  
  NativeEntryPointData::NativeEntryPointData(&this->super_NativeEntryPointData);
  this->nativeCodeData = (Type)0x0;
  this->inlineeFrameMap = (Type)0x0;
  this->sortedLazyBailoutRecordList = (Type)0x0;
  this->lazyBailOutRecordSlotOffset = 0;
  this->lazyBailOutThunkOffset = 0;
  this_00 = JITManager::GetJITManager();
  bVar2 = JITManager::IsOOPJITEnabled(this_00);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                       ,0x192,"(!JITManager::GetJITManager()->IsOOPJITEnabled())",
                       "!JITManager::GetJITManager()->IsOOPJITEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

InProcNativeEntryPointData::InProcNativeEntryPointData() :
    nativeCodeData(nullptr), inlineeFrameMap(nullptr), sortedLazyBailoutRecordList(nullptr),
    lazyBailOutRecordSlotOffset{0}, lazyBailOutThunkOffset{0}
#if !FLOATVAR
    , numberChunks(nullptr)
#endif
{
    Assert(!JITManager::GetJITManager()->IsOOPJITEnabled());
}